

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool parse_number(cJSON *item,parse_buffer *input_buffer)

{
  byte bVar1;
  uchar *puVar2;
  ulong uVar3;
  size_t sVar4;
  cJSON_bool cVar5;
  lconv *plVar6;
  long lVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  long in_FS_OFFSET;
  double dVar11;
  uchar *after_end;
  uchar number_c_string [64];
  byte *local_70;
  byte local_68 [64];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = (byte *)0x0;
  plVar6 = localeconv();
  cVar5 = 0;
  if ((input_buffer != (parse_buffer *)0x0) &&
     (puVar2 = input_buffer->content, cVar5 = 0, puVar2 != (uchar *)0x0)) {
    bVar1 = *plVar6->decimal_point;
    uVar3 = input_buffer->length;
    sVar4 = input_buffer->offset;
    lVar7 = 0;
    do {
      if ((uVar3 <= sVar4 + lVar7) ||
         ((bVar9 = puVar2[lVar7 + sVar4], 9 < bVar9 - 0x30 &&
          ((uVar10 = bVar9 - 0x2b, 0x3a < uVar10 ||
           (((0x400000004000005U >> ((ulong)uVar10 & 0x3f) & 1) == 0 &&
            (bVar9 = bVar1, (ulong)uVar10 != 3)))))))) goto LAB_00105ffc;
      local_68[lVar7] = bVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x3f);
    lVar7 = 0x3f;
LAB_00105ffc:
    local_68[lVar7] = 0;
    dVar11 = strtod((char *)local_68,(char **)&local_70);
    if (local_68 == local_70) {
      cVar5 = 0;
    }
    else {
      item->valuedouble = dVar11;
      iVar8 = 0x7fffffff;
      if ((dVar11 < 2147483647.0) && (iVar8 = -0x80000000, -2147483648.0 < dVar11)) {
        iVar8 = (int)dVar11;
      }
      item->valueint = iVar8;
      item->type = 8;
      input_buffer->offset = (size_t)(local_70 + (input_buffer->offset - (long)local_68));
      cVar5 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return cVar5;
}

Assistant:

static cJSON_bool parse_number(cJSON * const item, parse_buffer * const input_buffer)
{
    double number = 0;
    unsigned char *after_end = NULL;
    unsigned char number_c_string[64];
    unsigned char decimal_point = get_decimal_point();
    size_t i = 0;

    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false;
    }

    /* copy the number into a temporary buffer and replace '.' with the decimal point
     * of the current locale (for strtod)
     * This also takes care of '\0' not necessarily being available for marking the end of the input */
    for (i = 0; (i < (sizeof(number_c_string) - 1)) && can_access_at_index(input_buffer, i); i++)
    {
        switch (buffer_at_offset(input_buffer)[i])
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            case '+':
            case '-':
            case 'e':
            case 'E':
                number_c_string[i] = buffer_at_offset(input_buffer)[i];
                break;

            case '.':
                number_c_string[i] = decimal_point;
                break;

            default:
                goto loop_end;
        }
    }
loop_end:
    number_c_string[i] = '\0';

    number = strtod((const char*)number_c_string, (char**)&after_end);
    if (number_c_string == after_end)
    {
        return false; /* parse_error */
    }

    item->valuedouble = number;

    /* use saturation in case of overflow */
    if (number >= INT_MAX)
    {
        item->valueint = INT_MAX;
    }
    else if (number <= (double)INT_MIN)
    {
        item->valueint = INT_MIN;
    }
    else
    {
        item->valueint = (int)number;
    }

    item->type = cJSON_Number;

    input_buffer->offset += (size_t)(after_end - number_c_string);
    return true;
}